

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  int extraout_EAX;
  uint uVar1;
  int extraout_EAX_00;
  uint64_t a4;
  secp256k1_fe *psVar2;
  secp256k1_fe *psVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  secp256k1_scalar *a;
  int iVar9;
  secp256k1_fe *psVar10;
  secp256k1_fe *psVar11;
  secp256k1_fe *psVar12;
  long lVar13;
  long unaff_RBP;
  secp256k1_gej *in_RSI;
  ulong uVar14;
  secp256k1_ge *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_fe *psVar17;
  secp256k1_gej *r;
  secp256k1_gej *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_gej *in_R8;
  secp256k1_fe *psVar20;
  secp256k1_fe *psVar21;
  int iVar22;
  secp256k1_fe *psVar23;
  uint uVar24;
  secp256k1_fe *unaff_R12;
  secp256k1_fe *unaff_R13;
  secp256k1_modinv64_modinfo *unaff_R14;
  secp256k1_fe *a_00;
  secp256k1_fe *unaff_R15;
  bool bVar25;
  secp256k1_modinv64_signed62 f;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  secp256k1_ge *psStack_620;
  secp256k1_ge *psStack_618;
  secp256k1_gej *psStack_610;
  ulong uStack_608;
  uint uStack_5fc;
  secp256k1_fe sStack_5f8;
  secp256k1_ge sStack_5c8;
  secp256k1_fe sStack_558;
  secp256k1_ge asStack_528 [4];
  secp256k1_ge asStack_388 [4];
  secp256k1_fe *psStack_1e0;
  undefined1 *puStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  code *pcStack_1b8;
  secp256k1_gej sStack_1b0;
  secp256k1_fe *local_118;
  undefined1 local_110 [48];
  ulong auStack_e0 [5];
  secp256k1_fe local_b8;
  secp256k1_modinv64_trans2x2 local_88;
  secp256k1_fe local_68;
  
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  sStack_1b0.z.n[4] = 0x11bcdf;
  secp256k1_fe_verify(x);
  local_b8.n[0] = x->n[0];
  local_b8.n[1] = x->n[1];
  local_b8.n[2] = x->n[2];
  local_b8.n[3] = x->n[3];
  local_b8.n[4] = x->n[4];
  local_b8.magnitude = x->magnitude;
  local_b8.normalized = x->normalized;
  psVar10 = &local_b8;
  sStack_1b0.z.n[4] = 0x11bd02;
  secp256k1_fe_normalize_var(psVar10);
  sStack_1b0.z.n[4] = 0x11bd0a;
  psVar17 = psVar10;
  secp256k1_fe_verify(psVar10);
  if (local_b8.normalized == 0) {
LAB_0011c2b6:
    sStack_1b0.z.n[4] = 0x11c2bb;
    secp256k1_fe_is_square_var_cold_19();
    psVar11 = psVar10;
    a_00 = (secp256k1_fe *)unaff_R14;
LAB_0011c2bb:
    sStack_1b0.z.n[4] = 0x11c2c0;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((local_b8.n[2] == 0 && local_b8.n[3] == 0) && (local_b8.n[1] == 0 && local_b8.n[0] == 0))
        && local_b8.n[4] == 0) {
      psVar11 = (secp256k1_fe *)0x1;
    }
    else {
      local_110._0_8_ = (local_b8.n[1] << 0x34 | local_b8.n[0]) & 0x3fffffffffffffff;
      local_110._8_8_ = (ulong)((uint)local_b8.n[2] & 0xfffff) << 0x2a | local_b8.n[1] >> 10;
      in_R8 = (secp256k1_gej *)
              ((ulong)((uint)local_b8.n[3] & 0x3fffffff) << 0x20 | local_b8.n[2] >> 0x14);
      psVar17 = (secp256k1_fe *)((local_b8.n[4] & 0xffffffffff) << 0x16 | local_b8.n[3] >> 0x1e);
      local_110._32_8_ = local_b8.n[4] >> 0x28;
      auStack_e0[1] = 0;
      auStack_e0[2] = 0;
      local_110._40_8_ = -0x1000003d1;
      auStack_e0[0] = 0;
      auStack_e0[3] = 0x100;
      in_RSI = (secp256k1_gej *)(local_110._8_8_ | local_110._0_8_);
      psVar11 = psVar10;
      a_00 = (secp256k1_fe *)unaff_R14;
      local_110._16_8_ = in_R8;
      local_110._24_8_ = psVar17;
      if (((local_110._32_8_ == 0 && in_R8 == (secp256k1_gej *)0x0) &&
          in_RSI == (secp256k1_gej *)0x0) && psVar17 == (secp256k1_fe *)0x0) goto LAB_0011c2bb;
      psVar10 = (secp256k1_fe *)0x5;
      unaff_RBP = -1;
      uVar4 = 0;
      psVar11 = (secp256k1_fe *)0x0;
      do {
        psVar17 = (secp256k1_fe *)(auStack_e0[0] << 0x3e | local_110._40_8_);
        in_R8 = (secp256k1_gej *)(local_110._8_8_ << 0x3e | local_110._0_8_);
        psVar2 = (secp256k1_fe *)0x0;
        psVar20 = (secp256k1_fe *)0x0;
        unaff_R13 = (secp256k1_fe *)0x1;
        iVar7 = 0x3e;
        a_00 = (secp256k1_fe *)0x1;
        psVar16 = in_R8;
        psVar23 = psVar17;
        while( true ) {
          uVar14 = -1L << ((byte)iVar7 & 0x3f) | (ulong)psVar16;
          lVar13 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          bVar5 = (byte)lVar13;
          psVar21 = (secp256k1_fe *)((ulong)psVar16 >> (bVar5 & 0x3f));
          a_00 = (secp256k1_fe *)((long)a_00 << (bVar5 & 0x3f));
          psVar2 = (secp256k1_fe *)((long)psVar2 << (bVar5 & 0x3f));
          unaff_RBP = unaff_RBP - lVar13;
          in_RSI = (secp256k1_gej *)((ulong)psVar23 >> 2);
          uVar24 = ((uint)((ulong)psVar23 >> 1) ^ (uint)in_RSI) & (uint)lVar13 ^ (uint)psVar11;
          unaff_R12 = (secp256k1_fe *)(ulong)uVar24;
          iVar7 = iVar7 - (uint)lVar13;
          sStack_1b0._144_8_ = uVar4;
          local_118 = psVar10;
          if (iVar7 == 0) break;
          if (((ulong)psVar23 & 1) == 0) {
            sStack_1b0.z.n[4] = 0x11c270;
            secp256k1_fe_is_square_var_cold_7();
LAB_0011c270:
            sStack_1b0.z.n[4] = 0x11c275;
            secp256k1_fe_is_square_var_cold_6();
LAB_0011c275:
            sStack_1b0.z.n[4] = 0x11c27a;
            secp256k1_fe_is_square_var_cold_1();
LAB_0011c27a:
            sStack_1b0.z.n[4] = 0x11c27f;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_0011c27f;
          }
          if (((ulong)psVar21 & 1) == 0) goto LAB_0011c270;
          in_RSI = (secp256k1_gej *)((long)psVar2 * (long)in_R8 + (long)a_00 * (long)psVar17);
          bVar5 = 0x3e - (char)iVar7;
          psVar11 = (secp256k1_fe *)((long)psVar23 << (bVar5 & 0x3f));
          if (in_RSI != (secp256k1_gej *)psVar11) goto LAB_0011c275;
          psVar11 = (secp256k1_fe *)((long)unaff_R13 * (long)in_R8 + (long)psVar20 * (long)psVar17);
          in_RSI = (secp256k1_gej *)((long)psVar21 << (bVar5 & 0x3f));
          if ((secp256k1_gej *)psVar11 != in_RSI) goto LAB_0011c27a;
          iVar22 = (int)psVar23;
          iVar9 = (int)psVar21;
          if (unaff_RBP < 0) {
            unaff_RBP = -unaff_RBP;
            iVar6 = (int)unaff_RBP + 1;
            if (iVar7 <= iVar6) {
              iVar6 = iVar7;
            }
            in_RSI = (secp256k1_gej *)(ulong)(iVar6 - 0x3fU);
            if (0xffffffc1 < iVar6 - 0x3fU) {
              psVar11 = (secp256k1_fe *)
                        (ulong)(uVar24 ^ (uint)(((ulong)psVar21 & (ulong)psVar23) >> 1));
              unaff_R15 = (secp256k1_fe *)
                          ((ulong)(0x3fL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
              uVar24 = (iVar9 * iVar9 + 0x3e) * iVar9 * iVar22 & (uint)unaff_R15;
              psVar3 = psVar2;
              psVar2 = unaff_R13;
              psVar12 = psVar21;
              in_RSI = (secp256k1_gej *)a_00;
              a_00 = psVar20;
              goto LAB_0011bf8f;
            }
            goto LAB_0011c289;
          }
          iVar6 = (int)unaff_RBP + 1;
          if (iVar7 <= iVar6) {
            iVar6 = iVar7;
          }
          in_RSI = (secp256k1_gej *)(ulong)(iVar6 - 0x3fU);
          if (iVar6 - 0x3fU < 0xffffffc2) goto LAB_0011c284;
          unaff_R15 = (secp256k1_fe *)
                      ((ulong)(0xfL << (-(char)iVar6 & 0x3fU)) >> (-(char)iVar6 & 0x3fU));
          uVar24 = -(iVar9 * ((iVar22 * 2 + 2U & 8) + iVar22)) & (uint)unaff_R15;
          psVar3 = unaff_R13;
          psVar12 = psVar23;
          in_RSI = (secp256k1_gej *)psVar20;
          psVar23 = psVar21;
          psVar11 = unaff_R12;
LAB_0011bf8f:
          uVar14 = (ulong)uVar24;
          psVar16 = (secp256k1_gej *)((long)psVar23->n + uVar14 * (long)psVar12);
          psVar20 = (secp256k1_fe *)((long)(in_RSI->x).n + (long)a_00 * uVar14);
          unaff_R13 = (secp256k1_fe *)((long)psVar3->n + uVar14 * (long)psVar2);
          psVar23 = psVar12;
          unaff_R12 = psVar11;
          if (((ulong)psVar16 & (ulong)unaff_R15) != 0) {
LAB_0011c27f:
            sStack_1b0.z.n[4] = 0x11c284;
            secp256k1_fe_is_square_var_cold_4();
LAB_0011c284:
            sStack_1b0.z.n[4] = 0x11c289;
            secp256k1_fe_is_square_var_cold_3();
LAB_0011c289:
            sStack_1b0.z.n[4] = 0x11c28e;
            secp256k1_fe_is_square_var_cold_5();
            psVar10 = psVar11;
            unaff_R14 = (secp256k1_modinv64_modinfo *)a_00;
            goto LAB_0011c28e;
          }
        }
        psVar17 = SUB168(SEXT816((long)psVar2) * SEXT816((long)psVar20),8);
        uVar4 = (long)a_00 * (long)unaff_R13 - (long)psVar2 * (long)psVar20;
        uVar14 = (SUB168(SEXT816((long)a_00) * SEXT816((long)unaff_R13),8) - (long)psVar17) -
                 (ulong)((ulong)((long)a_00 * (long)unaff_R13) <
                        (ulong)((long)psVar2 * (long)psVar20));
        in_RSI = (secp256k1_gej *)(~uVar14 | uVar4 ^ 0xc000000000000000);
        local_88.u = (int64_t)a_00;
        local_88.v = (int64_t)psVar2;
        local_88.q = (int64_t)psVar20;
        local_88.r = (int64_t)unaff_R13;
        if ((in_RSI != (secp256k1_gej *)0x0) && (uVar4 != 0x4000000000000000 || uVar14 != 0))
        goto LAB_0011c2c5;
        unaff_R15 = (secp256k1_fe *)(local_110 + 0x28);
        iVar9 = (int)psVar10;
        unaff_R14 = &secp256k1_const_modinfo_fe;
        sStack_1b0.z.n[4] = 0x11c03c;
        in_RSI = (secp256k1_gej *)psVar10;
        psVar17 = unaff_R15;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R15,iVar9,
                           &secp256k1_const_modinfo_fe.modulus,0);
        unaff_R13 = (secp256k1_fe *)local_110;
        if (iVar7 < 1) {
LAB_0011c28e:
          sStack_1b0.z.n[4] = 0x11c293;
          secp256k1_fe_is_square_var_cold_15();
LAB_0011c293:
          sStack_1b0.z.n[4] = 0x11c298;
          secp256k1_fe_is_square_var_cold_14();
LAB_0011c298:
          sStack_1b0.z.n[4] = 0x11c29d;
          secp256k1_fe_is_square_var_cold_13();
LAB_0011c29d:
          sStack_1b0.z.n[4] = 0x11c2a2;
          secp256k1_fe_is_square_var_cold_12();
LAB_0011c2a2:
          sStack_1b0.z.n[4] = 0x11c2a7;
          secp256k1_fe_is_square_var_cold_11();
LAB_0011c2a7:
          sStack_1b0.z.n[4] = 0x11c2ac;
          secp256k1_fe_is_square_var_cold_10();
LAB_0011c2ac:
          sStack_1b0.z.n[4] = 0x11c2b1;
          secp256k1_fe_is_square_var_cold_9();
LAB_0011c2b1:
          sStack_1b0.z.n[4] = 0x11c2b6;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_0011c2b6;
        }
        sStack_1b0.z.n[4] = 0x11c05b;
        in_RSI = (secp256k1_gej *)psVar10;
        psVar17 = unaff_R15;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R15,iVar9,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar7) goto LAB_0011c293;
        sStack_1b0.z.n[4] = 0x11c072;
        in_RSI = (secp256k1_gej *)psVar10;
        psVar17 = unaff_R13;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R13,iVar9,
                           &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar7 < 1) goto LAB_0011c298;
        sStack_1b0.z.n[4] = 0x11c08c;
        in_RSI = (secp256k1_gej *)psVar10;
        psVar17 = unaff_R13;
        iVar7 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R13,iVar9,
                           &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar7) goto LAB_0011c29d;
        sStack_1b0.z.n[4] = 0x11c0a9;
        secp256k1_modinv64_update_fg_62_var
                  (iVar9,(secp256k1_modinv64_signed62 *)unaff_R15,
                   (secp256k1_modinv64_signed62 *)unaff_R13,&local_88);
        if (local_110._40_8_ != 1) {
LAB_0011c0d9:
          lVar13 = (long)iVar9;
          if ((-1 < lVar13 + -2 && auStack_e0[lVar13 + -2] == 0) &&
              (&local_118)[lVar13] == (secp256k1_fe *)0x0) {
            psVar10 = (secp256k1_fe *)(ulong)(iVar9 - 1);
          }
          sStack_1b0.z.n[4] = 0x11c103;
          iVar9 = (int)psVar10;
          in_RSI = (secp256k1_gej *)psVar10;
          psVar17 = unaff_R15;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R15,iVar9,
                             &secp256k1_const_modinfo_fe.modulus,0);
          if (iVar7 < 1) goto LAB_0011c2a2;
          sStack_1b0.z.n[4] = 0x11c11d;
          in_RSI = (secp256k1_gej *)psVar10;
          psVar17 = unaff_R15;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R15,iVar9,
                             &secp256k1_const_modinfo_fe.modulus,1);
          if (0 < iVar7) goto LAB_0011c2a7;
          sStack_1b0.z.n[4] = 0x11c134;
          in_RSI = (secp256k1_gej *)psVar10;
          psVar17 = unaff_R13;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar9,
                             &secp256k1_const_modinfo_fe.modulus,0);
          if (iVar7 < 1) goto LAB_0011c2ac;
          sStack_1b0.z.n[4] = 0x11c14e;
          in_RSI = (secp256k1_gej *)psVar10;
          psVar17 = unaff_R13;
          iVar7 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R13,iVar9,
                             &secp256k1_const_modinfo_fe.modulus,1);
          bVar25 = true;
          if (iVar7 < 0) goto LAB_0011c16d;
          goto LAB_0011c2b1;
        }
        if (1 < iVar9) {
          psVar17 = (secp256k1_fe *)0x1;
          uVar4 = 0;
          do {
            uVar4 = uVar4 | auStack_e0[(long)((long)&psVar17[-1].normalized + 3)];
            psVar17 = (secp256k1_fe *)((long)psVar17->n + 1);
          } while (psVar10 != psVar17);
          if (uVar4 != 0) goto LAB_0011c0d9;
        }
        sStack_1b0.z.normalized = 1 - (uVar24 * 2 & 2);
        bVar25 = false;
LAB_0011c16d:
        uVar24 = sStack_1b0.z.normalized;
        if (!bVar25) goto LAB_0011c190;
        uVar24 = sStack_1b0.infinity + 1;
        uVar4 = (ulong)uVar24;
        psVar11 = unaff_R12;
      } while (uVar24 != 0xc);
      uVar24 = 0;
LAB_0011c190:
      if (uVar24 == 0) {
        sStack_1b0.z.n[4] = 0x11c1aa;
        uVar24 = secp256k1_fe_sqrt((secp256k1_fe *)(local_110 + 0x28),&local_b8);
        psVar11 = (secp256k1_fe *)(ulong)uVar24;
      }
      else {
        psVar11 = (secp256k1_fe *)(ulong)(~uVar24 >> 0x1f);
      }
    }
    a_00 = &local_68;
    sStack_1b0.z.n[4] = 0x11c1bc;
    secp256k1_fe_verify(a_00);
    local_68.n[0] = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
    local_68.n[1] = (local_68.n[0] >> 0x34) + local_68.n[1];
    local_68.n[2] = (local_68.n[1] >> 0x34) + local_68.n[2];
    uVar4 = (local_68.n[2] >> 0x34) + local_68.n[3];
    in_R8 = (secp256k1_gej *)0xfffffffffffff;
    local_68.n[3] = uVar4 & 0xfffffffffffff;
    local_68.n[4] = (uVar4 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    local_68.n[2] = local_68.n[2] & 0xfffffffffffff;
    local_68.n[1] = local_68.n[1] & 0xfffffffffffff;
    local_68.n[0] = local_68.n[0] & 0xfffffffffffff;
    local_68.magnitude = 1;
    sStack_1b0.z.n[4] = 0x11c246;
    secp256k1_fe_verify(a_00);
    psVar17 = &local_b8;
    sStack_1b0.z.n[4] = 0x11c253;
    in_RSI = (secp256k1_gej *)a_00;
    iVar7 = secp256k1_fe_sqrt(psVar17,a_00);
    if ((int)psVar11 == iVar7) {
      return (int)psVar11;
    }
  }
  sStack_1b0.z.n[4] = 0x11c2c5;
  secp256k1_fe_is_square_var_cold_18();
LAB_0011c2c5:
  sStack_1b0.z.n[4] = (uint64_t)secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_16();
  psVar16 = &sStack_1b0;
  psVar18 = &sStack_1b0;
  psVar19 = &sStack_1b0;
  psVar10 = (secp256k1_fe *)0xfffffffffffff;
  pcStack_1b8 = (code *)0x11c2f7;
  sStack_1b0.z.n[1] = (uint64_t)psVar11;
  sStack_1b0.z.n[2] = (uint64_t)unaff_R12;
  sStack_1b0.z.n[3] = (uint64_t)a_00;
  sStack_1b0.z.n[4] = (uint64_t)unaff_R15;
  secp256k1_fe_verify(&in_RSI->x);
  uVar4 = ((in_RSI->x).n[4] >> 0x30) * 0x1000003d1 + (in_RSI->x).n[0];
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar14 = (uVar4 >> 0x34) + (in_RSI->x).n[1];
    psVar15 = (secp256k1_ge *)((uVar14 >> 0x34) + (in_RSI->x).n[2]);
    r = (secp256k1_gej *)(((ulong)psVar15 >> 0x34) + (in_RSI->x).n[3]);
    in_R8 = (secp256k1_gej *)(((ulong)r >> 0x34) + ((in_RSI->x).n[4] & 0xffffffffffff));
    puStack_1d8 = (undefined1 *)0x1000003d0;
    if ((((uVar14 | uVar4 | (ulong)psVar15 | (ulong)r) & 0xfffffffffffff) == 0 &&
         in_R8 == (secp256k1_gej *)0x0) ||
       (in_R8 = (secp256k1_gej *)((ulong)in_R8 ^ 0xf000000000000),
       ((uVar4 | 0x1000003d0) & uVar14 & (ulong)psVar15 & (ulong)r & (ulong)in_R8) ==
       0xfffffffffffff)) goto LAB_0011c4a9;
  }
  psVar10 = &sStack_1b0.y;
  pcStack_1b8 = (code *)0x11c3b0;
  secp256k1_fe_mul(psVar10,&in_RSI->x,psVar17);
  pcStack_1b8 = (code *)0x11c3be;
  secp256k1_fe_sqr(&sStack_1b0.x,psVar17);
  pcStack_1b8 = (code *)0x11c3cc;
  secp256k1_fe_mul(psVar10,psVar10,&sStack_1b0.x);
  pcStack_1b8 = (code *)0x11c3d7;
  secp256k1_fe_sqr(&sStack_1b0.x,&in_RSI->x);
  pcStack_1b8 = (code *)0x11c3e2;
  secp256k1_fe_sqr(&sStack_1b0.x,&sStack_1b0.x);
  pcStack_1b8 = (code *)0x11c3ea;
  secp256k1_fe_verify(&sStack_1b0.x);
  if (sStack_1b0.x.magnitude < 0x11) {
    sStack_1b0.x.n[0] = sStack_1b0.x.n[0] * 2;
    sStack_1b0.x.n[1] = sStack_1b0.x.n[1] * 2;
    sStack_1b0.x.n[2] = sStack_1b0.x.n[2] * 2;
    sStack_1b0.x.n[3] = sStack_1b0.x.n[3] * 2;
    sStack_1b0.x.n[4] = sStack_1b0.x.n[4] << 1;
    sStack_1b0.x.magnitude = sStack_1b0.x.magnitude * 2;
    sStack_1b0.x.normalized = 0;
    pcStack_1b8 = (code *)0x11c42d;
    secp256k1_fe_verify(&sStack_1b0.x);
    psVar17 = &sStack_1b0.y;
    pcStack_1b8 = (code *)0x11c43a;
    secp256k1_fe_verify(psVar17);
    pcStack_1b8 = (code *)0x11c442;
    secp256k1_fe_verify(&sStack_1b0.x);
    sStack_1b0.y.magnitude = sStack_1b0.x.magnitude + sStack_1b0.y.magnitude;
    in_RSI = &sStack_1b0;
    psVar15 = (secp256k1_ge *)psVar16;
    r = psVar19;
    if (sStack_1b0.y.magnitude < 0x21) {
      sStack_1b0.y.n[0] = sStack_1b0.y.n[0] + sStack_1b0.x.n[0];
      sStack_1b0.y.n[1] = sStack_1b0.y.n[1] + sStack_1b0.x.n[1];
      sStack_1b0.y.n[2] = sStack_1b0.y.n[2] + sStack_1b0.x.n[2];
      sStack_1b0.y.n[3] = sStack_1b0.y.n[3] + sStack_1b0.x.n[3];
      sStack_1b0.y.n[4] = sStack_1b0.y.n[4] + sStack_1b0.x.n[4];
      sStack_1b0.y.normalized = 0;
      pcStack_1b8 = (code *)0x11c48b;
      secp256k1_fe_verify(&sStack_1b0.y);
      pcStack_1b8 = (code *)0x11c493;
      iVar7 = secp256k1_fe_is_square_var(&sStack_1b0.y);
      return iVar7;
    }
  }
  else {
    pcStack_1b8 = (code *)0x11c4a4;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
    psVar15 = (secp256k1_ge *)psVar16;
    r = psVar18;
  }
  pcStack_1b8 = (code *)0x11c4a9;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  puStack_1d8 = (undefined1 *)&sStack_1b0;
LAB_0011c4a9:
  pcStack_1b8 = secp256k1_ecmult_const;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_1e0 = &in_RSI->x;
  psStack_1d0 = unaff_R13;
  psStack_1c8 = psVar17;
  psStack_1c0 = psVar10;
  pcStack_1b8 = (code *)unaff_RBP;
  secp256k1_ge_verify(psVar15);
  if (psVar15->infinity == 0) {
    secp256k1_scalar_add(&uStack_5fc,a,&secp256k1_ecmult_const_K);
    secp256k1_scalar_verify(&uStack_5fc);
    uStack_5fc = (-(uStack_5fc & 1) & 0xd) + uStack_5fc >> 1;
    secp256k1_scalar_verify(&uStack_5fc);
    secp256k1_scalar_split_lambda(&uStack_628,&uStack_62c,&uStack_5fc);
    secp256k1_scalar_add(&uStack_628,&uStack_628,&secp256k1_ecmult_const::S_OFFSET);
    secp256k1_scalar_add(&uStack_62c,&uStack_62c,&secp256k1_ecmult_const::S_OFFSET);
    iVar7 = 0x7f;
    do {
      secp256k1_scalar_verify(&uStack_628);
      secp256k1_scalar_verify(&uStack_62c);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    secp256k1_gej_set_ge(r,psVar15);
    secp256k1_ecmult_odd_multiples_table((int)asStack_388,asStack_528,&sStack_558,&r->x,in_R8);
    psStack_620 = asStack_528;
    psStack_618 = asStack_388;
    secp256k1_ge_table_set_globalz(4,asStack_388,&asStack_528[0].x);
    lVar13 = 0;
    do {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)((long)asStack_528[0].x.n + lVar13),
                 (secp256k1_ge *)((long)asStack_388[0].x.n + lVar13));
      lVar13 = lVar13 + 0x68;
    } while (lVar13 != 0x1a0);
    psVar10 = &sStack_5c8.y;
    psStack_618 = (secp256k1_ge *)&psStack_618[1].y;
    psStack_620 = (secp256k1_ge *)&psStack_620[1].y;
    uVar4 = 0x2a;
    psStack_610 = r;
    do {
      secp256k1_scalar_verify(&uStack_628);
      secp256k1_scalar_verify(&uStack_628);
      bVar5 = (char)uVar4 * '\x03';
      uVar24 = uStack_628 >> (bVar5 & 0x1f) & 7;
      if (10 < (uint)uVar4) {
        uVar24 = 0;
      }
      uStack_608 = uVar4;
      secp256k1_scalar_verify(&uStack_62c);
      secp256k1_scalar_verify(&uStack_62c);
      uStack_624 = uStack_62c >> (bVar5 & 0x1f) & 7;
      uVar1 = uVar24 >> 2 ^ 1;
      sStack_5c8.x.n[4] = asStack_388[0].x.n[4];
      sStack_5c8.x.magnitude = asStack_388[0].x.magnitude;
      sStack_5c8.x.normalized = asStack_388[0].x.normalized;
      sStack_5c8.x.n[2] = asStack_388[0].x.n[2];
      sStack_5c8.x.n[3] = asStack_388[0].x.n[3];
      sStack_5c8.x.n[0] = asStack_388[0].x.n[0];
      sStack_5c8.x.n[1] = asStack_388[0].x.n[1];
      sStack_5c8.y.n[4] = asStack_388[0].y.n[4];
      sStack_5c8.y.magnitude = asStack_388[0].y.magnitude;
      sStack_5c8.y.normalized = asStack_388[0].y.normalized;
      sStack_5c8.y.n[2] = asStack_388[0].y.n[2];
      sStack_5c8.y.n[3] = asStack_388[0].y.n[3];
      sStack_5c8.y.n[0] = asStack_388[0].y.n[0];
      sStack_5c8.y.n[1] = asStack_388[0].y.n[1];
      uVar4 = 1;
      psVar15 = psStack_618;
      do {
        bVar25 = ((-uVar1 ^ uVar24) & 3) == uVar4;
        secp256k1_fe_cmov(&sStack_5c8.x,(secp256k1_fe *)((long)psVar15 + -0x30),(uint)bVar25);
        secp256k1_fe_cmov(psVar10,&psVar15->x,(uint)bVar25);
        uVar4 = uVar4 + 1;
        psVar15 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar15 + 0x60))->n + 1);
      } while (uVar4 != 4);
      uVar8 = (uint)uStack_608;
      uVar24 = uStack_624;
      if (10 < uVar8) {
        uVar24 = 0;
      }
      sStack_5c8.infinity = 0;
      secp256k1_fe_verify(psVar10);
      secp256k1_fe_verify_magnitude(psVar10,1);
      sStack_5f8.n[0] = 0x3ffffbfffff0bc - sStack_5c8.y.n[0];
      sStack_5f8.n[1] = 0x3ffffffffffffc - sStack_5c8.y.n[1];
      sStack_5f8.n[2] = 0x3ffffffffffffc - sStack_5c8.y.n[2];
      sStack_5f8.n[3] = 0x3ffffffffffffc - sStack_5c8.y.n[3];
      sStack_5f8.n[4] = 0x3fffffffffffc - sStack_5c8.y.n[4];
      sStack_5f8.magnitude = 2;
      sStack_5f8.normalized = 0;
      secp256k1_fe_verify(&sStack_5f8);
      secp256k1_fe_cmov(psVar10,&sStack_5f8,uVar1);
      psVar16 = psStack_610;
      if (uVar8 == 0x2a) {
        secp256k1_gej_set_ge(psStack_610,&sStack_5c8);
      }
      else {
        iVar7 = 3;
        do {
          secp256k1_gej_double(psVar16,psVar16);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        secp256k1_gej_add_ge(psVar16,psVar16,&sStack_5c8);
      }
      uVar1 = uVar24 >> 2 ^ 1;
      sStack_5c8.x.n[4] = asStack_528[0].x.n[4];
      sStack_5c8.x.magnitude = asStack_528[0].x.magnitude;
      sStack_5c8.x.normalized = asStack_528[0].x.normalized;
      sStack_5c8.x.n[2] = asStack_528[0].x.n[2];
      sStack_5c8.x.n[3] = asStack_528[0].x.n[3];
      sStack_5c8.x.n[0] = asStack_528[0].x.n[0];
      sStack_5c8.x.n[1] = asStack_528[0].x.n[1];
      sStack_5c8.y.n[0] = asStack_528[0].y.n[0];
      sStack_5c8.y.n[1] = asStack_528[0].y.n[1];
      sStack_5c8.y.n[4] = asStack_528[0].y.n[4];
      sStack_5c8.y.magnitude = asStack_528[0].y.magnitude;
      sStack_5c8.y.normalized = asStack_528[0].y.normalized;
      sStack_5c8.y.n[2] = asStack_528[0].y.n[2];
      sStack_5c8.y.n[3] = asStack_528[0].y.n[3];
      uVar4 = 1;
      psVar15 = psStack_620;
      do {
        uVar8 = (uint)(((-uVar1 ^ uVar24) & 3) == uVar4);
        secp256k1_fe_cmov(&sStack_5c8.x,(secp256k1_fe *)((long)psVar15 + -0x30),uVar8);
        secp256k1_fe_cmov(psVar10,&psVar15->x,uVar8);
        uVar4 = uVar4 + 1;
        psVar15 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar15 + 0x60))->n + 1);
      } while (uVar4 != 4);
      sStack_5c8.infinity = 0;
      secp256k1_fe_verify(psVar10);
      secp256k1_fe_verify_magnitude(psVar10,1);
      sStack_5f8.n[0] = 0x3ffffbfffff0bc - sStack_5c8.y.n[0];
      sStack_5f8.n[1] = 0x3ffffffffffffc - sStack_5c8.y.n[1];
      sStack_5f8.n[2] = 0x3ffffffffffffc - sStack_5c8.y.n[2];
      sStack_5f8.n[3] = 0x3ffffffffffffc - sStack_5c8.y.n[3];
      sStack_5f8.n[4] = 0x3fffffffffffc - sStack_5c8.y.n[4];
      sStack_5f8.magnitude = 2;
      sStack_5f8.normalized = 0;
      secp256k1_fe_verify(&sStack_5f8);
      secp256k1_fe_cmov(psVar10,&sStack_5f8,uVar1);
      psVar16 = psStack_610;
      secp256k1_gej_add_ge(psStack_610,psStack_610,&sStack_5c8);
      uVar4 = (ulong)((int)uStack_608 - 1);
    } while ((int)uStack_608 != 0);
    secp256k1_fe_mul(&psVar16->z,&psVar16->z,&sStack_558);
    return extraout_EAX_00;
  }
  secp256k1_gej_set_infinity(r);
  return extraout_EAX;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}